

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::Path(Path *this,string *path)

{
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  sanitize(this);
  return;
}

Assistant:

Path::Path(std::string path)
{
  m_path = path;
  sanitize();
}